

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_fft.hpp
# Opt level: O2

void __thiscall
re::fft::simd_fft<float,_256L>::stage_2n
          (simd_fft<float,_256L> *this,span<std::complex<float>,_256L> out,int_t stage)

{
  uint uVar1;
  byte bVar2;
  lane<std::complex<float>_> b;
  lane<std::complex<float>_> b_00;
  lane<std::complex<float>_> extraout_RDX;
  lane<std::complex<float>_> b_01;
  lane<std::complex<float>_> b_02;
  lane<std::complex<float>_> b_03;
  lane<std::complex<float>_> b_04;
  lane<std::complex<float>_> b_05;
  lane<std::complex<float>_> b_06;
  lane<std::complex<float>_> b_07;
  lane<std::complex<float>_> b_08;
  lane<std::complex<float>_> b_09;
  lane<std::complex<float>_> b_10;
  lane<std::complex<float>_> extraout_RDX_00;
  lane<std::complex<float>_> a;
  long lVar3;
  int i;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  add<std::complex<float>_> local_e5;
  sub<std::complex<float>_> local_e4;
  add<std::complex<float>_> local_e3;
  sub<std::complex<float>_> local_e2;
  add<std::complex<float>_> local_e1;
  sub<std::complex<float>_> local_e0;
  add<std::complex<float>_> local_df;
  sub<std::complex<float>_> local_de;
  mul<std::complex<float>_> local_dd;
  mul<std::complex<float>_> local_dc;
  mul<std::complex<float>_> local_db;
  mul<std::complex<float>_> local_da;
  mul<std::complex<float>_> local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  _ComplexT local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  simd_fft<float,_256L> *local_80;
  lane<std::complex<float>_> local_78;
  lane<std::complex<float>_> local_70;
  _ComplexT local_58;
  undefined8 uStack_50;
  
  bVar2 = (byte)stage;
  uVar1 = 1 << (bVar2 & 0x1f);
  b = (lane<std::complex<float>_>)(long)(3 << (bVar2 & 0x1f));
  a._0_4_ = 0 << (bVar2 & 0x1f);
  a.a._M_elems[0]._M_value._4_4_ = 0;
  local_78 = (lane<std::complex<float>_>)0x0;
  if (0 < (int)uVar1) {
    local_78.a._M_elems[0]._M_value._4_4_ = 0;
    local_78.a._M_elems[0]._M_value._0_4_ = uVar1;
  }
  lVar6 = (long)out.storage_.data_ + (long)(int)uVar1 * 8;
  lVar3 = (long)out.storage_.data_ + (long)(2 << (bVar2 & 0x1f)) * 8;
  lVar5 = (long)out.storage_.data_ + (long)b * 8;
  local_80 = this;
  while (a != local_78) {
    local_58 = (local_80->w_twiddles)._M_elems[(long)a]._M_value;
    uStack_50 = 0;
    local_70 = a;
    simd::intrinsics::mul<std::complex<float>_>::operator()(&local_d9,a,b);
    simd::intrinsics::mul<std::complex<float>_>::operator()(&local_da,a,b_00);
    b = extraout_RDX;
    for (lVar4 = 0; lVar4 < 0x100; lVar4 = lVar4 + (4 << (bVar2 & 0x1f))) {
      local_b8 = ((pointer)((long)out.storage_.data_ + lVar4 * 8))->_M_value;
      uStack_b0 = 0;
      local_d8 = *(undefined8 *)(lVar3 + lVar4 * 8);
      uStack_d0 = 0;
      local_c8 = *(undefined8 *)(lVar5 + lVar4 * 8);
      uStack_c0 = 0;
      simd::intrinsics::mul<std::complex<float>_>::operator()(&local_db,a,b);
      simd::intrinsics::mul<std::complex<float>_>::operator()(&local_dc,a,b_01);
      simd::intrinsics::mul<std::complex<float>_>::operator()(&local_dd,a,b_02);
      simd::intrinsics::sub<std::complex<float>_>::operator()(&local_de,a,b_03);
      simd::intrinsics::add<std::complex<float>_>::operator()(&local_df,a,b_04);
      simd::intrinsics::sub<std::complex<float>_>::operator()(&local_e0,a,b_05);
      simd::intrinsics::add<std::complex<float>_>::operator()(&local_e1,a,b_06);
      simd::intrinsics::sub<std::complex<float>_>::operator()(&local_e2,a,b_07);
      local_98 = extraout_XMM0_Da;
      uStack_94 = extraout_XMM0_Db;
      simd::intrinsics::add<std::complex<float>_>::operator()(&local_e3,a,b_08);
      local_d8 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      simd::intrinsics::sub<std::complex<float>_>::operator()(&local_e4,a,b_09);
      local_a8 = extraout_XMM0_Da_01;
      uStack_a4 = extraout_XMM0_Db_01;
      simd::intrinsics::add<std::complex<float>_>::operator()(&local_e5,a,b_10);
      ((pointer)((long)out.storage_.data_ + lVar4 * 8))->_M_value =
           CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      *(undefined8 *)(lVar6 + lVar4 * 8) = local_d8;
      *(ulong *)(lVar3 + lVar4 * 8) = CONCAT44(uStack_a4,local_a8);
      *(ulong *)(lVar5 + lVar4 * 8) = CONCAT44(uStack_94,local_98);
      b = extraout_RDX_00;
    }
    lVar5 = lVar5 + 8;
    lVar3 = lVar3 + 8;
    lVar6 = lVar6 + 8;
    out.storage_.data_ =
         (storage_type<gsl::details::extent_type<256L>_>)((long)out.storage_.data_ + 8);
    a = (lane<std::complex<float>_>)((long)local_70 + 1);
  }
  return;
}

Assistant:

void stage_2n(gsl::span<cpx_t, N> out, int_t stage) const noexcept {
        auto const stride = 1 << stage;

        for (auto j = 0; j < stride; j += simd::width<cpx_t>) {
            auto w1 = simd::load(&w_twiddles[j]);
            auto w2 = simd::intrinsics::mul<cpx_t>()(w1, w1);
            auto w3 = simd::intrinsics::mul<cpx_t>()(w1, w2);

            for (auto i = 0; i < N; i += 4*stride) {
                auto x_a = simd::load(&out[j + i + 0 * stride]);
                auto x_b = simd::load(&out[j + i + 1 * stride]);
                auto x_c = simd::load(&out[j + i + 2 * stride]);
                auto x_d = simd::load(&out[j + i + 3 * stride]);

                auto w_x_b = simd::intrinsics::mul<cpx_t>()(x_b, w1);
                auto w_x_c = simd::intrinsics::mul<cpx_t>()(x_c, w2);
                auto w_x_d = simd::intrinsics::mul<cpx_t>()(x_d, w3);

                x_d = simd::intrinsics::sub<cpx_t>()(w_x_c, w_x_d);
                x_c = simd::intrinsics::add<cpx_t>()(w_x_c, w_x_d);
                x_b = simd::intrinsics::sub<cpx_t>()(x_a, w_x_b);
                x_a = simd::intrinsics::add<cpx_t>()(x_a, w_x_b);

                w_x_d = x_d;
                x_d = simd::intrinsics::sub<cpx_t>()(x_b, w_x_d);
                x_b = simd::intrinsics::add<cpx_t>()(x_b, w_x_d);

                w_x_c = x_c;
                x_c = simd::intrinsics::sub<cpx_t>()(x_a, w_x_c);
                x_a = simd::intrinsics::add<cpx_t>()(x_a, w_x_c);

                simd::store(&out[j + i + 0 * stride], x_a);
                simd::store(&out[j + i + 1 * stride], x_b);
                simd::store(&out[j + i + 2 * stride], x_c);
                simd::store(&out[j + i + 3 * stride], x_d);
            }
        }
    }